

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

void ImPlot::
     PlotShadedEx<ImPlot::GetterXsYs<unsigned_long_long>,ImPlot::GetterXsYs<unsigned_long_long>>
               (char *label_id,GetterXsYs<unsigned_long_long> *getter1,
               GetterXsYs<unsigned_long_long> *getter2,bool fit2)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  unsigned_long_long *puVar7;
  unsigned_long_long *puVar8;
  ImPlotPlot *pIVar9;
  unsigned_long_long uVar10;
  unsigned_long_long uVar11;
  ImPlotRange *pIVar12;
  ImPlotContext *pIVar13;
  bool bVar14;
  uint uVar15;
  ImU32 col;
  long lVar16;
  ImDrawList *DrawList;
  undefined7 in_register_00000009;
  uint uVar17;
  int iVar18;
  double dVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  double dVar22;
  double dVar23;
  double dVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  byte local_88;
  byte local_84;
  TransformerLinLin local_7c;
  GetterXsYs<unsigned_long_long> *local_78;
  GetterXsYs<unsigned_long_long> *local_70;
  undefined4 local_64;
  ShadedRenderer<ImPlot::GetterXsYs<unsigned_long_long>,_ImPlot::GetterXsYs<unsigned_long_long>,_ImPlot::TransformerLinLin>
  local_60;
  
  bVar14 = BeginItem(label_id,1);
  pIVar13 = GImPlot;
  if (bVar14) {
    if (GImPlot->FitThisFrame == true) {
      local_64 = (undefined4)CONCAT71(in_register_00000009,fit2);
      iVar1 = getter1->Count;
      if (0 < iVar1) {
        puVar7 = getter1->Xs;
        puVar8 = getter1->Ys;
        iVar2 = getter1->Offset;
        iVar3 = getter1->Stride;
        pIVar9 = GImPlot->CurrentPlot;
        iVar4 = pIVar9->CurrentYAxis;
        uVar5 = (pIVar9->XAxis).Flags;
        pIVar12 = GImPlot->ExtentsY;
        uVar6 = pIVar9->YAxis[iVar4].Flags;
        iVar18 = 0;
        uVar15 = uVar5 & 0x20;
        uVar17 = uVar6 & 0x20;
        do {
          lVar16 = (long)(((iVar2 + iVar18) % iVar1 + iVar1) % iVar1) * (long)iVar3;
          uVar10 = *(unsigned_long_long *)((long)puVar7 + lVar16);
          auVar20._8_4_ = (int)(uVar10 >> 0x20);
          auVar20._0_8_ = uVar10;
          auVar20._12_4_ = 0x45300000;
          dVar22 = (auVar20._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)uVar10) - 4503599627370496.0);
          uVar11 = *(unsigned_long_long *)((long)puVar8 + lVar16);
          auVar25._8_4_ = (int)(uVar11 >> 0x20);
          auVar25._0_8_ = uVar11;
          auVar25._12_4_ = 0x45300000;
          dVar19 = (auVar25._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)uVar11) - 4503599627370496.0);
          if ((uVar5 >> 10 & 1) == 0) {
            if ((uVar10 != 0) || (uVar15 == 0)) {
LAB_001f278a:
              dVar23 = (pIVar13->ExtentsX).Min;
              dVar24 = dVar22;
              if (dVar23 <= dVar22) {
                dVar24 = dVar23;
              }
              (pIVar13->ExtentsX).Min = dVar24;
              dVar23 = (pIVar13->ExtentsX).Max;
              dVar24 = dVar22;
              if (dVar22 <= dVar23) {
                dVar24 = dVar23;
              }
              (pIVar13->ExtentsX).Max = dVar24;
            }
          }
          else if (((pIVar9->YAxis[iVar4].Range.Min <= dVar19) &&
                   (dVar19 <= pIVar9->YAxis[iVar4].Range.Max)) &&
                  (local_88 = (byte)(uVar15 >> 5), (uVar10 == 0 & local_88) == 0))
          goto LAB_001f278a;
          if ((uVar6 >> 10 & 1) == 0) {
            if ((uVar11 != 0) || (uVar17 == 0)) {
LAB_001f27e7:
              dVar22 = pIVar12[iVar4].Min;
              dVar23 = dVar19;
              if (dVar22 <= dVar19) {
                dVar23 = dVar22;
              }
              pIVar12[iVar4].Min = dVar23;
              dVar22 = pIVar13->ExtentsY[iVar4].Max;
              if (dVar19 <= dVar22) {
                dVar19 = dVar22;
              }
              pIVar13->ExtentsY[iVar4].Max = dVar19;
            }
          }
          else if ((((pIVar9->XAxis).Range.Min <= dVar22) && (dVar22 <= (pIVar9->XAxis).Range.Max))
                  && (local_84 = (byte)(uVar17 >> 5), (uVar11 == 0 & local_84) == 0))
          goto LAB_001f27e7;
          iVar18 = iVar18 + 1;
        } while (iVar1 != iVar18);
      }
      if ((fit2) && (iVar1 = getter2->Count, 0 < iVar1)) {
        puVar7 = getter2->Xs;
        puVar8 = getter2->Ys;
        iVar2 = getter2->Offset;
        iVar3 = getter2->Stride;
        pIVar9 = pIVar13->CurrentPlot;
        iVar4 = pIVar9->CurrentYAxis;
        uVar5 = (pIVar9->XAxis).Flags;
        uVar6 = pIVar9->YAxis[iVar4].Flags;
        iVar18 = 0;
        uVar15 = uVar5 & 0x20;
        uVar17 = uVar6 & 0x20;
        do {
          lVar16 = (long)(((iVar2 + iVar18) % iVar1 + iVar1) % iVar1) * (long)iVar3;
          uVar10 = *(unsigned_long_long *)((long)puVar7 + lVar16);
          auVar21._8_4_ = (int)(uVar10 >> 0x20);
          auVar21._0_8_ = uVar10;
          auVar21._12_4_ = 0x45300000;
          dVar22 = (auVar21._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)uVar10) - 4503599627370496.0);
          uVar11 = *(unsigned_long_long *)((long)puVar8 + lVar16);
          auVar26._8_4_ = (int)(uVar11 >> 0x20);
          auVar26._0_8_ = uVar11;
          auVar26._12_4_ = 0x45300000;
          dVar19 = (auVar26._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)uVar11) - 4503599627370496.0);
          if ((uVar5 >> 10 & 1) == 0) {
            if ((uVar10 != 0) || (uVar15 == 0)) {
LAB_001f2925:
              dVar23 = (pIVar13->ExtentsX).Min;
              dVar24 = dVar22;
              if (dVar23 <= dVar22) {
                dVar24 = dVar23;
              }
              (pIVar13->ExtentsX).Min = dVar24;
              dVar23 = (pIVar13->ExtentsX).Max;
              dVar24 = dVar22;
              if (dVar22 <= dVar23) {
                dVar24 = dVar23;
              }
              (pIVar13->ExtentsX).Max = dVar24;
            }
          }
          else if (((pIVar9->YAxis[iVar4].Range.Min <= dVar19) &&
                   (dVar19 <= pIVar9->YAxis[iVar4].Range.Max)) &&
                  (local_88 = (byte)(uVar15 >> 5), (uVar10 == 0 & local_88) == 0))
          goto LAB_001f2925;
          if ((uVar6 >> 10 & 1) == 0) {
            if ((uVar11 != 0) || (uVar17 == 0)) {
LAB_001f2983:
              dVar22 = pIVar13->ExtentsY[iVar4].Min;
              dVar23 = dVar19;
              if (dVar22 <= dVar19) {
                dVar23 = dVar22;
              }
              pIVar13->ExtentsY[iVar4].Min = dVar23;
              dVar22 = pIVar13->ExtentsY[iVar4].Max;
              if (dVar19 <= dVar22) {
                dVar19 = dVar22;
              }
              pIVar13->ExtentsY[iVar4].Max = dVar19;
            }
          }
          else if ((((pIVar9->XAxis).Range.Min <= dVar22) && (dVar22 <= (pIVar9->XAxis).Range.Max))
                  && (local_84 = (byte)(uVar17 >> 5), (uVar11 == 0 & local_84) == 0))
          goto LAB_001f2983;
          iVar18 = iVar18 + 1;
        } while (iVar1 != iVar18);
      }
    }
    local_78 = getter2;
    local_70 = getter1;
    DrawList = GetPlotDrawList();
    if ((pIVar13->NextItemData).RenderFill == true) {
      col = ImGui::GetColorU32((pIVar13->NextItemData).Colors + 1);
      switch(GImPlot->Scales[GImPlot->CurrentPlot->CurrentYAxis]) {
      case 0:
        local_7c.YAxis = GImPlot->CurrentPlot->CurrentYAxis;
        ShadedRenderer<ImPlot::GetterXsYs<unsigned_long_long>,_ImPlot::GetterXsYs<unsigned_long_long>,_ImPlot::TransformerLinLin>
        ::ShadedRenderer(&local_60,local_70,local_78,&local_7c,col);
        RenderPrimitives<ImPlot::ShadedRenderer<ImPlot::GetterXsYs<unsigned_long_long>,ImPlot::GetterXsYs<unsigned_long_long>,ImPlot::TransformerLinLin>>
                  (&local_60,DrawList,&GImPlot->CurrentPlot->PlotRect);
        break;
      case 1:
        local_7c.YAxis = GImPlot->CurrentPlot->CurrentYAxis;
        ShadedRenderer<ImPlot::GetterXsYs<unsigned_long_long>,_ImPlot::GetterXsYs<unsigned_long_long>,_ImPlot::TransformerLogLin>
        ::ShadedRenderer((ShadedRenderer<ImPlot::GetterXsYs<unsigned_long_long>,_ImPlot::GetterXsYs<unsigned_long_long>,_ImPlot::TransformerLogLin>
                          *)&local_60,local_70,local_78,(TransformerLogLin *)&local_7c,col);
        RenderPrimitives<ImPlot::ShadedRenderer<ImPlot::GetterXsYs<unsigned_long_long>,ImPlot::GetterXsYs<unsigned_long_long>,ImPlot::TransformerLogLin>>
                  ((ShadedRenderer<ImPlot::GetterXsYs<unsigned_long_long>,_ImPlot::GetterXsYs<unsigned_long_long>,_ImPlot::TransformerLogLin>
                    *)&local_60,DrawList,&GImPlot->CurrentPlot->PlotRect);
        break;
      case 2:
        local_7c.YAxis = GImPlot->CurrentPlot->CurrentYAxis;
        ShadedRenderer<ImPlot::GetterXsYs<unsigned_long_long>,_ImPlot::GetterXsYs<unsigned_long_long>,_ImPlot::TransformerLinLog>
        ::ShadedRenderer((ShadedRenderer<ImPlot::GetterXsYs<unsigned_long_long>,_ImPlot::GetterXsYs<unsigned_long_long>,_ImPlot::TransformerLinLog>
                          *)&local_60,local_70,local_78,(TransformerLinLog *)&local_7c,col);
        RenderPrimitives<ImPlot::ShadedRenderer<ImPlot::GetterXsYs<unsigned_long_long>,ImPlot::GetterXsYs<unsigned_long_long>,ImPlot::TransformerLinLog>>
                  ((ShadedRenderer<ImPlot::GetterXsYs<unsigned_long_long>,_ImPlot::GetterXsYs<unsigned_long_long>,_ImPlot::TransformerLinLog>
                    *)&local_60,DrawList,&GImPlot->CurrentPlot->PlotRect);
        break;
      case 3:
        local_7c.YAxis = GImPlot->CurrentPlot->CurrentYAxis;
        ShadedRenderer<ImPlot::GetterXsYs<unsigned_long_long>,_ImPlot::GetterXsYs<unsigned_long_long>,_ImPlot::TransformerLogLog>
        ::ShadedRenderer((ShadedRenderer<ImPlot::GetterXsYs<unsigned_long_long>,_ImPlot::GetterXsYs<unsigned_long_long>,_ImPlot::TransformerLogLog>
                          *)&local_60,local_70,local_78,(TransformerLogLog *)&local_7c,col);
        RenderPrimitives<ImPlot::ShadedRenderer<ImPlot::GetterXsYs<unsigned_long_long>,ImPlot::GetterXsYs<unsigned_long_long>,ImPlot::TransformerLogLog>>
                  ((ShadedRenderer<ImPlot::GetterXsYs<unsigned_long_long>,_ImPlot::GetterXsYs<unsigned_long_long>,_ImPlot::TransformerLogLog>
                    *)&local_60,DrawList,&GImPlot->CurrentPlot->PlotRect);
      }
    }
    pIVar13 = GImPlot;
    PopPlotClipRect();
    ImPlotNextItemData::Reset(&pIVar13->NextItemData);
    pIVar13->PreviousItem = pIVar13->CurrentItem;
    pIVar13->CurrentItem = (ImPlotItem *)0x0;
  }
  return;
}

Assistant:

inline void PlotShadedEx(const char* label_id, const Getter1& getter1, const Getter2& getter2, bool fit2) {
    if (BeginItem(label_id, ImPlotCol_Fill)) {
        if (FitThisFrame()) {
            for (int i = 0; i < getter1.Count; ++i)
                FitPoint(getter1(i));
            if (fit2) {
                for (int i = 0; i < getter2.Count; ++i)
                    FitPoint(getter2(i));
            }
        }
        const ImPlotNextItemData& s = GetItemData();
        ImDrawList & DrawList = *GetPlotDrawList();
        if (s.RenderFill) {
            ImU32 col = ImGui::GetColorU32(s.Colors[ImPlotCol_Fill]);
            switch (GetCurrentScale()) {
                case ImPlotScale_LinLin: RenderPrimitives(ShadedRenderer<Getter1,Getter2,TransformerLinLin>(getter1,getter2,TransformerLinLin(), col), DrawList, GImPlot->CurrentPlot->PlotRect); break;
                case ImPlotScale_LogLin: RenderPrimitives(ShadedRenderer<Getter1,Getter2,TransformerLogLin>(getter1,getter2,TransformerLogLin(), col), DrawList, GImPlot->CurrentPlot->PlotRect); break;
                case ImPlotScale_LinLog: RenderPrimitives(ShadedRenderer<Getter1,Getter2,TransformerLinLog>(getter1,getter2,TransformerLinLog(), col), DrawList, GImPlot->CurrentPlot->PlotRect); break;
                case ImPlotScale_LogLog: RenderPrimitives(ShadedRenderer<Getter1,Getter2,TransformerLogLog>(getter1,getter2,TransformerLogLog(), col), DrawList, GImPlot->CurrentPlot->PlotRect); break;
            }
        }
        EndItem();
    }
}